

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O0

void __thiscall
slang::ast::Compilation::checkDPIMethods
          (Compilation *this,
          span<const_slang::ast::SubroutineSymbol_*const,_18446744073709551615UL> dpiImports)

{
  type pDVar1;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  string_view arg_00;
  string_view arg_01;
  string_view arg_02;
  string_view arg_03;
  string_view arg_04;
  Token name_00;
  Token cid;
  Token cid_00;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  SourceRange sourceRange_03;
  SourceRange sourceRange_04;
  SourceRange sourceRange_05;
  LookupLocation location;
  SourceRange sourceRange_06;
  SubroutineSymbol **__x_00;
  bool bVar2;
  reference ppSVar3;
  reference ppVar4;
  SourceLocation SVar5;
  reference ppFVar6;
  allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>
  *paVar7;
  equal_to<const_slang::ast::SubroutineSymbol_*> *this_00;
  raw_key_type *__y_00;
  pointer ppVar8;
  allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>
  *paVar9;
  pointer ppVar10;
  allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>
  *paVar11;
  type_conflict1 *ptVar12;
  pointer ppVar13;
  Token TVar14;
  string_view sVar15;
  string_view sVar16;
  SourceRange SVar17;
  SourceRange SVar18;
  ArgList AVar19;
  Diagnostic *diag_9;
  type_conflict1 *inserted_3;
  type *it_3;
  Diagnostic *diag_8;
  type_conflict1 *inserted_2;
  type *it_2;
  string_view cId_1;
  Diagnostic *diag_7;
  type_conflict1 *inserted_1;
  type *it_1;
  Diagnostic *diag_6;
  Type *type;
  FormalArgumentSymbol *arg;
  iterator __end3;
  iterator __begin3;
  ArgList *__range3;
  Diagnostic *diag_5;
  Type *retType;
  Diagnostic *diag_4;
  Diagnostic *diag_3;
  Diagnostic *diag_2;
  SubroutineSymbol *sub_1;
  Diagnostic *diag_1;
  Symbol *symbol;
  string_view name;
  type *scope_1;
  type *syntax_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_>_>
  *__range2_1;
  vector<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_>_>
  exports;
  flat_hash_map<const_SubroutineSymbol_*,_const_DPIExportSyntax_*> previousExports;
  flat_hash_map<std::tuple<std::string_view,_const_Scope_*>,_const_DPIExportSyntax_*> exportsByScope
  ;
  Diagnostic *diag;
  type_conflict1 *inserted;
  type *it;
  string_view cId;
  DPIImportSyntax *dis;
  Scope *scope;
  SyntaxNode *syntax;
  SubroutineSymbol *sub;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::SubroutineSymbol_*const,_18446744073709551615UL> *__range2;
  flat_hash_map<std::string_view,_const_SubroutineSymbol_*> nameMap;
  anon_class_1_0_00000001 getCId;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>,_std::basic_string_view<char,_std::char_traits<char>_>_&,_void>
  x;
  locator loc;
  size_t pos0;
  size_t hash;
  basic_string_view<char,_std::char_traits<char>_> *k;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>,_const_slang::ast::SubroutineSymbol_*&&,_void>
  x_1;
  locator loc_1;
  size_t pos0_1;
  size_t hash_1;
  SubroutineSymbol **k_1;
  uint n_1;
  value_type *p_1;
  value_type *elements_1;
  int mask_1;
  group_type *pg_1;
  size_t pos_1;
  prober pb_1;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>,_std::basic_string_view<char,_std::char_traits<char>_>_&,_void>
  x_2;
  locator loc_2;
  size_t pos0_2;
  size_t hash_2;
  basic_string_view<char,_std::char_traits<char>_> *k_2;
  uint n_2;
  value_type *p_2;
  value_type *elements_2;
  int mask_2;
  group_type *pg_2;
  size_t pos_2;
  prober pb_2;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_&&,_void>
  x_3;
  locator loc_3;
  size_t pos0_3;
  size_t hash_3;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*> *k_3;
  uint n_3;
  value_type *p_3;
  value_type *elements_3;
  int mask_3;
  group_type *pg_3;
  size_t pos_3;
  prober pb_3;
  SourceLocation in_stack_fffffffffffff0f8;
  SourceLocation SVar20;
  SourceLocation in_stack_fffffffffffff100;
  SourceLocation in_stack_fffffffffffff108;
  Diagnostic *in_stack_fffffffffffff110;
  SourceLocation in_stack_fffffffffffff118;
  Diagnostic *in_stack_fffffffffffff120;
  SourceLocation in_stack_fffffffffffff128;
  SourceLocation in_stack_fffffffffffff130;
  undefined6 in_stack_fffffffffffff140;
  undefined1 in_stack_fffffffffffff146;
  undefined1 in_stack_fffffffffffff147;
  Type *in_stack_fffffffffffff148;
  Diagnostic *in_stack_fffffffffffff150;
  raw_key_type *in_stack_fffffffffffff158;
  undefined4 in_stack_fffffffffffff160;
  uint in_stack_fffffffffffff164;
  SubroutineSymbol *in_stack_fffffffffffff168;
  Info *in_stack_fffffffffffff170;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffff178;
  SubroutineSymbol *in_stack_fffffffffffff180;
  SubroutineSymbol *in_stack_fffffffffffff188;
  table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>_>
  *in_stack_fffffffffffff190;
  Diagnostic *in_stack_fffffffffffff1a0;
  SourceLocation in_stack_fffffffffffff1a8;
  SourceLocation in_stack_fffffffffffff1b0;
  SourceLocation in_stack_fffffffffffff238;
  SourceLocation in_stack_fffffffffffff240;
  SourceLocation in_stack_fffffffffffff248;
  SourceLocation in_stack_fffffffffffff250;
  Scope *in_stack_fffffffffffff448;
  raw_key_type *in_stack_fffffffffffff450;
  undefined4 in_stack_fffffffffffff458;
  uint in_stack_fffffffffffff45c;
  undefined1 *in_stack_fffffffffffff460;
  size_t in_stack_fffffffffffff468;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>,_std::basic_string_view<char,_std::char_traits<char>_>_&,_void>
  *in_stack_fffffffffffff470;
  char *in_stack_fffffffffffff490;
  size_t in_stack_fffffffffffff498;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*> local_ac8;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_ab0;
  SourceLocation local_a98;
  undefined4 local_a8c;
  string_view local_a88;
  SourceRange local_a78;
  undefined4 local_a64;
  Diagnostic *local_a60;
  type_conflict1 *local_a58;
  type *local_a50;
  SubroutineSymbol *local_a48;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_a40;
  undefined8 local_a28;
  Info *pIStack_a20;
  undefined8 local_a18;
  Info *pIStack_a10;
  string_view local_a08;
  SourceLocation local_9f8;
  undefined4 local_9ec;
  size_t local_9e8;
  char *pcStack_9e0;
  SourceRange local_9d8;
  undefined4 local_9c4;
  SourceLocation local_9c0;
  type_conflict1 *local_9b8;
  type *local_9b0;
  SubroutineSymbol *local_9a8;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_9a0;
  SourceLocation local_988;
  undefined4 local_97c;
  SourceLocation local_978;
  undefined4 local_96c;
  Diagnostic *local_968;
  Type *local_960;
  SourceLocation local_958;
  undefined4 local_94c;
  FormalArgumentSymbol *local_948;
  FormalArgumentSymbol **local_940;
  __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
  local_938;
  ArgList local_930;
  ArgList *local_920;
  SourceLocation local_918;
  undefined4 local_90c;
  SourceLocation local_908;
  undefined4 local_8fc;
  Diagnostic *local_8f8;
  Type *local_8f0;
  SourceLocation local_8e8;
  undefined4 local_8dc;
  SourceRange local_8d8;
  undefined4 local_8c4;
  Diagnostic *local_8c0;
  bitmask<slang::ast::MethodFlags> local_8b2;
  SourceLocation local_8b0;
  undefined4 local_8a4;
  SourceRange local_8a0;
  undefined4 local_88c;
  Diagnostic *local_888;
  SourceLocation local_880;
  undefined4 local_874;
  SourceRange local_870;
  undefined4 local_85c;
  Diagnostic *local_858;
  SubroutineSymbol *local_850;
  SourceLocation local_848;
  undefined4 local_83c;
  string_view local_838;
  SourceRange local_820;
  undefined4 local_80c;
  Diagnostic *local_808;
  bitmask<slang::ast::LookupFlags> local_7fc;
  SourceRange local_7f8;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  string_view local_7d8;
  Symbol *local_7c8;
  string_view local_7c0;
  SourceRange local_7b0;
  undefined4 local_79c;
  string_view local_788;
  SourceLocation *local_778;
  SourceLocation local_770;
  DPIExportSyntax *local_768;
  Scope *pSStack_760;
  pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*> *local_758;
  __normal_iterator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_*,_std::vector<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_>_>_>
  local_750;
  undefined1 *local_748;
  undefined1 local_740 [24];
  undefined1 local_728 [8];
  size_t local_720;
  ulong local_708;
  ulong local_700;
  undefined1 local_6f8 [60];
  undefined4 local_6bc;
  string_view local_6b8;
  SourceLocation local_6a8;
  undefined4 local_69c;
  Diagnostic *local_698;
  type_conflict1 *local_690;
  WildcardImportData *local_688;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_680;
  Token local_668;
  ExpressionSyntax *local_658;
  SourceLocation SStack_650;
  string_view local_648;
  DPIImportSyntax *local_638;
  Scope *local_630;
  SyntaxNode *local_618;
  __extent_storage<18446744073709551615UL> local_610;
  Statement *local_608;
  __normal_iterator<const_slang::ast::SubroutineSymbol_*const_*,_std::span<const_slang::ast::SubroutineSymbol_*const,_18446744073709551615UL>_>
  local_600;
  __extent_storage<18446744073709551615UL> local_5f8;
  undefined1 local_5f0 [8];
  MethodPrototypeSymbol *local_5e8;
  ulong local_5d0;
  ulong local_5c8;
  undefined1 local_5b0 [16];
  SourceLocation local_5a0;
  string_view *local_598;
  undefined1 *local_590;
  SourceLocation local_588;
  SubroutineSymbol **local_580;
  undefined1 *local_578;
  SourceLocation local_570;
  string_view *local_568;
  undefined1 *local_560;
  SourceLocation local_558;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*> *local_550
  ;
  SubroutineSymbol *local_548;
  undefined1 local_539;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>,_std::basic_string_view<char,_std::char_traits<char>_>_&,_void>
  local_538;
  SourceLocation local_530;
  basic_string_view<char,_std::char_traits<char>_> *local_528;
  undefined1 *local_520;
  bool local_511 [25];
  iterator local_4f8;
  bool local_4e1 [25];
  iterator local_4c8;
  bool local_4b1;
  iterator local_4b0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>
  local_4a0;
  size_t local_488;
  size_t local_480;
  Scope *local_478;
  SourceLocation local_470;
  basic_string_view<char,_std::char_traits<char>_> *local_468;
  undefined1 *local_460;
  undefined1 *local_458;
  uint local_44c;
  value_type *local_448;
  value_type *local_440;
  uint local_434;
  group_type *local_430;
  size_t local_428;
  pow2_quadratic_prober local_420;
  size_t local_410;
  size_t local_408;
  Scope *local_400;
  undefined1 *local_3f8;
  undefined1 local_3e9;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>,_const_slang::ast::SubroutineSymbol_*&&,_void>
  local_3e8;
  SourceLocation local_3e0;
  SubroutineSymbol **local_3d8;
  undefined1 *local_3d0;
  bool local_3c1 [25];
  iterator local_3a8;
  bool local_391 [25];
  iterator local_378;
  bool local_361;
  iterator local_360;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>
  local_350;
  size_t local_338;
  size_t local_330;
  SubroutineSymbol **local_328;
  SourceLocation local_320;
  SubroutineSymbol **local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  uint local_2fc;
  value_type *local_2f8;
  value_type *local_2f0;
  uint local_2e4;
  group_type *local_2e0;
  size_t local_2d8;
  pow2_quadratic_prober local_2d0;
  size_t local_2c0;
  size_t local_2b8;
  SubroutineSymbol **local_2b0;
  undefined1 *local_2a8;
  undefined1 local_299;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>,_std::basic_string_view<char,_std::char_traits<char>_>_&,_void>
  local_298;
  SourceLocation local_290;
  basic_string_view<char,_std::char_traits<char>_> *local_288;
  undefined1 *local_280;
  bool local_271 [25];
  iterator local_258;
  bool local_241 [25];
  iterator local_228;
  bool local_211;
  iterator local_210;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>
  local_200;
  size_t local_1e8;
  size_t local_1e0;
  basic_string_view<char,_std::char_traits<char>_> *local_1d8;
  SourceLocation local_1d0;
  basic_string_view<char,_std::char_traits<char>_> *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  uint local_1ac;
  value_type *local_1a8;
  value_type *local_1a0;
  uint local_194;
  group_type *local_190;
  size_t local_188;
  pow2_quadratic_prober local_180;
  size_t local_170;
  size_t local_168;
  basic_string_view<char,_std::char_traits<char>_> *local_160;
  undefined1 *local_158;
  undefined1 local_149;
  basic_string_view<char,_std::char_traits<char>_> local_148;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*> *local_138
  ;
  SubroutineSymbol *local_130;
  bool local_121 [25];
  iterator local_108;
  bool local_f1 [25];
  iterator local_d8;
  bool local_c1;
  iterator local_c0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>
  local_b0;
  Info *local_98;
  table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>_>
  *local_90;
  Diagnostic *local_88;
  SourceLocation local_80;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*> *local_78;
  undefined1 *local_70;
  SubroutineSymbol *local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>_>
  *local_20;
  Info *local_18;
  Diagnostic *local_10;
  SubroutineSymbol *local_8;
  
  boost::unordered::
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>_>
  ::unordered_flat_map
            ((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>_>
              *)in_stack_fffffffffffff120);
  local_5f8._M_extent_value = (size_t)local_5b0;
  local_600._M_current =
       (SubroutineSymbol **)
       std::span<const_slang::ast::SubroutineSymbol_*const,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::SubroutineSymbol_*const,_18446744073709551615UL> *)
                  in_stack_fffffffffffff0f8);
  local_608 = (Statement *)
              std::span<const_slang::ast::SubroutineSymbol_*const,_18446744073709551615UL>::end
                        ((span<const_slang::ast::SubroutineSymbol_*const,_18446744073709551615UL> *)
                         in_stack_fffffffffffff108);
  sVar15._M_str = in_stack_fffffffffffff490;
  sVar15._M_len = in_stack_fffffffffffff498;
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<const_slang::ast::SubroutineSymbol_*const_*,_std::span<const_slang::ast::SubroutineSymbol_*const,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::SubroutineSymbol_*const_*,_std::span<const_slang::ast::SubroutineSymbol_*const,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffff100,
                       (__normal_iterator<const_slang::ast::SubroutineSymbol_*const_*,_std::span<const_slang::ast::SubroutineSymbol_*const,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffff0f8);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    ppSVar3 = __gnu_cxx::
              __normal_iterator<const_slang::ast::SubroutineSymbol_*const_*,_std::span<const_slang::ast::SubroutineSymbol_*const,_18446744073709551615UL>_>
              ::operator*(&local_600);
    local_610._M_extent_value = (size_t)*ppSVar3;
    local_618 = Symbol::getSyntax((Symbol *)local_610._M_extent_value);
    local_630 = Symbol::getParentScope((Symbol *)local_610._M_extent_value);
    local_638 = slang::syntax::SyntaxNode::as<slang::syntax::DPIImportSyntax>(local_618);
    local_658 = *(ExpressionSyntax **)&local_638->c_identifier;
    SStack_650 = (SourceLocation)(local_638->c_identifier).info;
    not_null<slang::syntax::FunctionPrototypeSyntax_*>::operator->
              ((not_null<slang::syntax::FunctionPrototypeSyntax_*> *)0x34fff6);
    not_null<slang::syntax::NameSyntax_*>::operator->
              ((not_null<slang::syntax::NameSyntax_*> *)0x350011);
    TVar14 = slang::syntax::SyntaxNode::getLastToken((SyntaxNode *)in_stack_fffffffffffff130);
    cid.info = in_stack_fffffffffffff170;
    cid._0_8_ = in_stack_fffffffffffff168;
    name_00.info._0_4_ = in_stack_fffffffffffff160;
    name_00._0_8_ = in_stack_fffffffffffff158;
    name_00.info._4_4_ = in_stack_fffffffffffff164;
    local_668 = TVar14;
    sVar15 = checkDPIMethods::anon_class_1_0_00000001::operator()
                       ((anon_class_1_0_00000001 *)in_stack_fffffffffffff150,
                        (Scope *)in_stack_fffffffffffff148,cid,name_00);
    local_648 = sVar15;
    bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_648);
    if (!bVar2) {
      in_stack_fffffffffffff460 = local_5f0;
      local_598 = &local_648;
      local_5a0 = (SourceLocation)&local_610;
      local_590 = in_stack_fffffffffffff460;
      local_530 = local_5a0;
      local_528 = local_598;
      local_520 = in_stack_fffffffffffff460;
      paVar9 = boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>_>
               ::al((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>_>
                     *)0x350167);
      in_stack_fffffffffffff470 = &local_538;
      boost::unordered::detail::foa::
      alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>,_std::basic_string_view<char,_std::char_traits<char>_>_&,_void>
      ::alloc_cted_or_fwded_key_type(in_stack_fffffffffffff470,paVar9,local_528);
      local_468 = boost::unordered::detail::foa::
                  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>,_std::basic_string_view<char,_std::char_traits<char>_>_&,_void>
                  ::move_or_fwd(in_stack_fffffffffffff470);
      local_460 = &local_539;
      local_470 = local_530;
      local_458 = in_stack_fffffffffffff460;
      local_478 = (Scope *)boost::unordered::detail::foa::
                           table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SubroutineSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::SubroutineSymbol_const*>>>
                           ::
                           key_from<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SubroutineSymbol_const*>
                                     (local_468,local_530);
      local_480 = boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SubroutineSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::SubroutineSymbol_const*>>>
                  ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                            ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>_>
                              *)in_stack_fffffffffffff100,
                             (basic_string_view<char,_std::char_traits<char>_> *)
                             in_stack_fffffffffffff0f8);
      in_stack_fffffffffffff468 =
           boost::unordered::detail::foa::
           table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>_>
           ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>_>
                           *)in_stack_fffffffffffff100,(size_t)in_stack_fffffffffffff0f8);
      local_400 = local_478;
      local_410 = local_480;
      local_488 = in_stack_fffffffffffff468;
      local_408 = in_stack_fffffffffffff468;
      local_3f8 = in_stack_fffffffffffff460;
      boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                (&local_420,in_stack_fffffffffffff468);
      do {
        local_428 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_420);
        local_430 = boost::unordered::detail::foa::
                    table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>_>
                    ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>_>
                              *)0x3502e1);
        local_430 = local_430 + local_428;
        in_stack_fffffffffffff45c =
             boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             match((group15<boost::unordered::detail::foa::plain_integral> *)
                   in_stack_fffffffffffff108,(size_t)in_stack_fffffffffffff100);
        local_434 = in_stack_fffffffffffff45c;
        if (in_stack_fffffffffffff45c != 0) {
          local_440 = boost::unordered::detail::foa::
                      table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>_>
                      ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>_>
                                  *)0x35033f);
          local_448 = local_440 + local_428 * 0xf;
          do {
            local_44c = boost::unordered::detail::foa::unchecked_countr_zero(0);
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>_>
            ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>_>
                    *)0x350392);
            in_stack_fffffffffffff448 = local_400;
            in_stack_fffffffffffff450 =
                 boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SubroutineSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::SubroutineSymbol_const*>>>
                 ::
                 key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::SubroutineSymbol_const*>>
                           ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>
                             *)0x3503c6);
            bVar2 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                    operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                               in_stack_fffffffffffff120,
                               (basic_string_view<char,_std::char_traits<char>_> *)
                               in_stack_fffffffffffff118,
                               (basic_string_view<char,_std::char_traits<char>_> *)
                               in_stack_fffffffffffff110);
            if (bVar2) {
              boost::unordered::detail::foa::
              table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>
              ::table_locator(&local_4a0,local_430,local_44c,local_448 + local_44c);
              goto LAB_003504e2;
            }
            local_434 = local_434 - 1 & local_434;
          } while (local_434 != 0);
        }
        bVar2 = boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                          ((group15<boost::unordered::detail::foa::plain_integral> *)
                           in_stack_fffffffffffff100,(size_t)in_stack_fffffffffffff0f8);
        if (bVar2) {
          memset(&local_4a0,0,0x18);
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>
          ::table_locator(&local_4a0);
          goto LAB_003504e2;
        }
        bVar2 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                          (&local_420,*(size_t *)(in_stack_fffffffffffff460 + 8));
      } while (bVar2);
      memset(&local_4a0,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>
      ::table_locator(&local_4a0);
LAB_003504e2:
      bVar2 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                        ((table_locator *)&local_4a0);
      if (bVar2) {
        local_4b0 = boost::unordered::detail::foa::
                    table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>_>
                    ::make_iterator((locator *)0x350504);
        local_4b1 = false;
        std::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
        ::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                  (&local_680,&local_4b0,&local_4b1);
      }
      else if (local_5c8 < local_5d0) {
        in_stack_fffffffffffff0f8 = local_470;
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SubroutineSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::SubroutineSymbol_const*>>>
        ::
        unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::ast::SubroutineSymbol_const*&>
                  ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>_>
                    *)in_stack_fffffffffffff130,(size_t)in_stack_fffffffffffff128,
                   (size_t)in_stack_fffffffffffff120,(try_emplace_args_t *)in_stack_fffffffffffff118
                   ,(basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff110,
                   (SubroutineSymbol **)
                   CONCAT17(in_stack_fffffffffffff147,
                            CONCAT16(in_stack_fffffffffffff146,in_stack_fffffffffffff140)));
        local_4c8 = boost::unordered::detail::foa::
                    table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>_>
                    ::make_iterator((locator *)0x3505a6);
        local_4e1[0] = true;
        std::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
        ::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                  (&local_680,&local_4c8,local_4e1);
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SubroutineSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::SubroutineSymbol_const*>>>
        ::
        unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::ast::SubroutineSymbol_const*&>
                  ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>_>
                    *)in_stack_fffffffffffff190,(size_t)in_stack_fffffffffffff188,
                   (try_emplace_args_t *)in_stack_fffffffffffff180,in_stack_fffffffffffff178,
                   (SubroutineSymbol **)in_stack_fffffffffffff170);
        local_4f8 = boost::unordered::detail::foa::
                    table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>_>
                    ::make_iterator((locator *)0x350621);
        local_511[0] = true;
        std::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
        ::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                  (&local_680,&local_4f8,local_511);
      }
      local_688 = (WildcardImportData *)
                  std::
                  get<0ul,boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SubroutineSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>*,false>,bool>
                            ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                              *)0x350669);
      local_690 = std::
                  get<1ul,boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SubroutineSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>*,false>,bool>
                            ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                              *)0x35067e);
      if ((*local_690 & 1U) == 0) {
        boost::unordered::detail::foa::
        table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
        ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                      *)in_stack_fffffffffffff100);
        bVar2 = checkSignaturesMatch
                          (in_stack_fffffffffffff168,
                           (SubroutineSymbol *)
                           CONCAT44(in_stack_fffffffffffff164,in_stack_fffffffffffff160));
        if (!bVar2) {
          local_69c = 0x8000d;
          local_6a8 = *(SourceLocation *)(local_610._M_extent_value + 0x18);
          local_698 = Scope::addDiag((Scope *)in_stack_fffffffffffff1a0,
                                     in_stack_fffffffffffff1b0._4_4_,in_stack_fffffffffffff1a8);
          arg_00._M_str = (char *)in_stack_fffffffffffff150;
          arg_00._M_len = (size_t)in_stack_fffffffffffff148;
          local_6b8 = local_648;
          Diagnostic::operator<<
                    ((Diagnostic *)
                     CONCAT17(in_stack_fffffffffffff147,
                              CONCAT16(in_stack_fffffffffffff146,in_stack_fffffffffffff140)),arg_00)
          ;
          local_6bc = 0xa0001;
          ppVar10 = boost::unordered::detail::foa::
                    table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                    ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                  *)in_stack_fffffffffffff100);
          local_6f8._48_8_ = (ppVar10->second->super_Symbol).location;
          Diagnostic::addNote((Diagnostic *)in_stack_fffffffffffff100,
                              SUB84((ulong)in_stack_fffffffffffff110 >> 0x20,0),
                              in_stack_fffffffffffff108);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_slang::ast::SubroutineSymbol_*const_*,_std::span<const_slang::ast::SubroutineSymbol_*const,_18446744073709551615UL>_>
    ::operator++(&local_600);
  }
  boost::unordered::
  unordered_flat_map<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>_>
  ::unordered_flat_map
            ((unordered_flat_map<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>_>
              *)in_stack_fffffffffffff120);
  boost::unordered::
  unordered_flat_map<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*,_slang::hash<const_slang::ast::SubroutineSymbol_*,_void>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
  ::unordered_flat_map
            ((unordered_flat_map<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*,_slang::hash<const_slang::ast::SubroutineSymbol_*,_void>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
              *)in_stack_fffffffffffff120);
  std::
  vector<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_>_>
  ::vector((vector<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_>_>
            *)in_stack_fffffffffffff150,
           (vector<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_>_>
            *)in_stack_fffffffffffff148);
  local_748 = local_740;
  local_750._M_current =
       (pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*> *)
       std::
       vector<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_>_>
       ::begin((vector<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_>_>
                *)in_stack_fffffffffffff0f8);
  local_758 = (pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*> *)
              std::
              vector<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_>_>
              ::end((vector<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_>_>
                     *)in_stack_fffffffffffff0f8);
  SVar17.endLoc = in_stack_fffffffffffff100;
  SVar17.startLoc = in_stack_fffffffffffff0f8;
  do {
    bVar2 = __gnu_cxx::
            operator==<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_*,_std::vector<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_>_>_>
                      ((__normal_iterator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_*,_std::vector<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_>_>_>
                        *)SVar17.endLoc,
                       (__normal_iterator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_*,_std::vector<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_>_>_>
                        *)SVar17.startLoc);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      std::
      vector<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_>_>
      ::~vector((vector<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_>_>
                 *)in_stack_fffffffffffff110);
      boost::unordered::
      unordered_flat_map<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*,_slang::hash<const_slang::ast::SubroutineSymbol_*,_void>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
      ::~unordered_flat_map
                ((unordered_flat_map<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*,_slang::hash<const_slang::ast::SubroutineSymbol_*,_void>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
                  *)0x3529c0);
      boost::unordered::
      unordered_flat_map<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>_>
      ::~unordered_flat_map
                ((unordered_flat_map<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>_>
                  *)0x3529cd);
      boost::unordered::
      unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>_>
      ::~unordered_flat_map
                ((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>_>
                  *)0x3529da);
      return;
    }
    ppVar4 = __gnu_cxx::
             __normal_iterator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_*,_std::vector<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_>_>_>
             ::operator*(&local_750);
    local_768 = ppVar4->first;
    pSStack_760 = ppVar4->second;
    local_770 = (SourceLocation)
                std::get<0ul,slang::syntax::DPIExportSyntax_const*,slang::ast::Scope_const*>
                          ((pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>
                            *)0x350894);
    local_778 = (SourceLocation *)
                std::get<1ul,slang::syntax::DPIExportSyntax_const*,slang::ast::Scope_const*>
                          ((pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>
                            *)0x3508a9);
    sVar16 = parsing::Token::valueText((Token *)in_stack_fffffffffffff110);
    local_788 = sVar16;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff110,
               (char *)in_stack_fffffffffffff108);
    __x._M_str = (char *)in_stack_fffffffffffff130;
    __x._M_len = (size_t)in_stack_fffffffffffff128;
    __y._M_str = (char *)in_stack_fffffffffffff120;
    __y._M_len = (size_t)in_stack_fffffffffffff118;
    bVar2 = std::operator==(__x,__y);
    if (bVar2) {
      local_79c = 0xea0006;
      SVar17 = parsing::Token::range((Token *)in_stack_fffffffffffff120);
      SVar18.endLoc = in_stack_fffffffffffff248;
      SVar18.startLoc = in_stack_fffffffffffff240;
      local_7b0 = SVar17;
      Scope::addDiag((Scope *)in_stack_fffffffffffff238,in_stack_fffffffffffff250._4_4_,SVar18);
    }
    sVar16 = parsing::Token::valueText((Token *)in_stack_fffffffffffff110);
    local_7e8 = LookupLocation::max;
    uStack_7e0 = DAT_00d8a540;
    local_7d8 = sVar16;
    local_7c0 = sVar16;
    SVar17 = parsing::Token::range((Token *)in_stack_fffffffffffff120);
    local_7f8 = SVar17;
    bitmask<slang::ast::LookupFlags>::bitmask(&local_7fc,None);
    sVar16._M_str = (char *)in_stack_fffffffffffff470;
    sVar16._M_len = in_stack_fffffffffffff468;
    location.scope._4_4_ = in_stack_fffffffffffff45c;
    location.scope._0_4_ = in_stack_fffffffffffff458;
    location._8_8_ = in_stack_fffffffffffff460;
    sourceRange_06.endLoc = (SourceLocation)sVar15._M_len;
    sourceRange_06.startLoc = (SourceLocation)sVar15._M_str;
    SVar17 = local_7f8;
    local_7c8 = Lookup::unqualifiedAt
                          (in_stack_fffffffffffff448,sVar16,location,sourceRange_06,
                           (bitmask<slang::ast::LookupFlags>)
                           (underlying_type)((ulong)in_stack_fffffffffffff450 >> 0x20));
    if (local_7c8 != (Symbol *)0x0) {
      if (local_7c8->kind == Subroutine) {
        local_850 = Symbol::as<slang::ast::SubroutineSymbol>((Symbol *)0x350c9c);
        if (((local_850->subroutineKind == Function) &&
            (((*(type *)local_770)->functionOrTask).kind == TaskKeyword)) ||
           ((local_850->subroutineKind == Task &&
            (((*(type *)local_770)->functionOrTask).kind == FunctionKeyword)))) {
          local_85c = 0x7000d;
          SVar18 = parsing::Token::range((Token *)in_stack_fffffffffffff120);
          sourceRange_00.endLoc = in_stack_fffffffffffff248;
          sourceRange_00.startLoc = in_stack_fffffffffffff240;
          local_870 = SVar18;
          local_858 = Scope::addDiag((Scope *)in_stack_fffffffffffff238,
                                     in_stack_fffffffffffff250._4_4_,sourceRange_00);
          local_874 = 0x50001;
          local_880 = local_7c8->location;
          Diagnostic::addNote((Diagnostic *)SVar17.endLoc,
                              SUB84((ulong)in_stack_fffffffffffff110 >> 0x20,0),
                              in_stack_fffffffffffff108);
        }
        else {
          SVar5 = (SourceLocation)Symbol::getParentScope(&local_850->super_Symbol);
          if (SVar5 == *local_778) {
            bitmask<slang::ast::MethodFlags>::bitmask(&local_8b2,DPIImport);
            bVar2 = bitmask<slang::ast::MethodFlags>::has
                              ((bitmask<slang::ast::MethodFlags> *)SVar17.endLoc,
                               (bitmask<slang::ast::MethodFlags> *)SVar17.startLoc);
            if (bVar2) {
              local_8c4 = 0x6000d;
              SVar18 = parsing::Token::range((Token *)in_stack_fffffffffffff120);
              sourceRange_02.endLoc = in_stack_fffffffffffff248;
              sourceRange_02.startLoc = in_stack_fffffffffffff240;
              local_8d8 = SVar18;
              local_8c0 = Scope::addDiag((Scope *)in_stack_fffffffffffff238,
                                         in_stack_fffffffffffff250._4_4_,sourceRange_02);
              local_8dc = 0x50001;
              local_8e8 = (local_850->super_Symbol).location;
              Diagnostic::addNote((Diagnostic *)SVar17.endLoc,
                                  SUB84((ulong)in_stack_fffffffffffff110 >> 0x20,0),
                                  in_stack_fffffffffffff108);
            }
            else {
              local_8f0 = SubroutineSymbol::getReturnType((SubroutineSymbol *)0x351044);
              bVar2 = Type::isValidForDPIReturn((Type *)SVar17.startLoc);
              if (!bVar2) {
                bVar2 = Type::isError((Type *)0x351092);
                if (!bVar2) {
                  local_8fc = 0x570006;
                  local_908 = (local_850->super_Symbol).location;
                  local_8f8 = Scope::addDiag((Scope *)in_stack_fffffffffffff1a0,
                                             in_stack_fffffffffffff1b0._4_4_,
                                             in_stack_fffffffffffff1a8);
                  ast::operator<<(in_stack_fffffffffffff150,in_stack_fffffffffffff148);
                  local_90c = 0x50001;
                  local_918 = parsing::Token::location(&(*(type *)local_770)->name);
                  Diagnostic::addNote((Diagnostic *)SVar17.endLoc,
                                      SUB84((ulong)in_stack_fffffffffffff110 >> 0x20,0),
                                      in_stack_fffffffffffff108);
                  goto LAB_00352994;
                }
              }
              AVar19 = SubroutineSymbol::getArguments((SubroutineSymbol *)SVar17.startLoc);
              local_920 = &local_930;
              local_930 = AVar19;
              local_938._M_current =
                   (FormalArgumentSymbol **)
                   std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>
                   ::begin((span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>
                            *)SVar17.startLoc);
              local_940 = (FormalArgumentSymbol **)
                          std::
                          span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>
                          ::end((span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>
                                 *)in_stack_fffffffffffff108);
              while( true ) {
                bVar2 = __gnu_cxx::
                        operator==<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                                  ((__normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                                    *)SVar17.endLoc,
                                   (__normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                                    *)SVar17.startLoc);
                if (((bVar2 ^ 0xffU) & 1) == 0) break;
                ppFVar6 = __gnu_cxx::
                          __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                          ::operator*(&local_938);
                local_948 = *ppFVar6;
                if (local_948->direction == Ref) {
                  local_94c = 0x270006;
                  local_958 = (local_948->super_VariableSymbol).super_ValueSymbol.super_Symbol.
                              location;
                  Scope::addDiag((Scope *)in_stack_fffffffffffff1a0,in_stack_fffffffffffff1b0._4_4_,
                                 in_stack_fffffffffffff1a8);
                }
                local_960 = ValueSymbol::getType((ValueSymbol *)0x35129b);
                bVar2 = Type::isValidForDPIArg((Type *)in_stack_fffffffffffff118);
                if (!bVar2) {
                  bVar2 = Type::isError((Type *)0x3512e9);
                  if (!bVar2) {
                    local_96c = 0x560006;
                    local_978 = (local_948->super_VariableSymbol).super_ValueSymbol.super_Symbol.
                                location;
                    local_968 = Scope::addDiag((Scope *)in_stack_fffffffffffff1a0,
                                               in_stack_fffffffffffff1b0._4_4_,
                                               in_stack_fffffffffffff1a8);
                    ast::operator<<(in_stack_fffffffffffff150,in_stack_fffffffffffff148);
                    local_97c = 0x50001;
                    local_988 = parsing::Token::location(&(*(type *)local_770)->name);
                    Diagnostic::addNote((Diagnostic *)SVar17.endLoc,
                                        SUB84((ulong)in_stack_fffffffffffff110 >> 0x20,0),
                                        in_stack_fffffffffffff108);
                  }
                }
                __gnu_cxx::
                __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                ::operator++(&local_938);
              }
              local_9a8 = local_850;
              local_580 = &local_9a8;
              local_588 = local_770;
              local_3e0 = local_770;
              local_578 = local_728;
              local_3d8 = local_580;
              local_3d0 = local_728;
              paVar7 = boost::unordered::detail::foa::
                       table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::SubroutineSymbol_*,_void>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
                       ::al((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::SubroutineSymbol_*,_void>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
                             *)0x351477);
              boost::unordered::detail::foa::
              alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>,_const_slang::ast::SubroutineSymbol_*&&,_void>
              ::alloc_cted_or_fwded_key_type(&local_3e8,paVar7,local_3d8);
              local_318 = boost::unordered::detail::foa::
                          alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>,_const_slang::ast::SubroutineSymbol_*&&,_void>
                          ::move_or_fwd(&local_3e8);
              local_310 = &local_3e9;
              local_320 = local_3e0;
              local_308 = local_728;
              local_328 = boost::unordered::detail::foa::
                          table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::SubroutineSymbol_const*,slang::syntax::DPIExportSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::SubroutineSymbol_const*,void>,std::equal_to<slang::ast::SubroutineSymbol_const*>,std::allocator<std::pair<slang::ast::SubroutineSymbol_const*const,slang::syntax::DPIExportSyntax_const*>>>
                          ::
                          key_from<slang::ast::SubroutineSymbol_const*,slang::syntax::DPIExportSyntax_const*>
                                    (local_318,local_3e0);
              local_330 = boost::unordered::detail::foa::
                          table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::SubroutineSymbol_const*,slang::syntax::DPIExportSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::SubroutineSymbol_const*,void>,std::equal_to<slang::ast::SubroutineSymbol_const*>,std::allocator<std::pair<slang::ast::SubroutineSymbol_const*const,slang::syntax::DPIExportSyntax_const*>>>
                          ::hash_for<slang::ast::SubroutineSymbol_const*>
                                    ((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::SubroutineSymbol_*,_void>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
                                      *)SVar17.endLoc,(SubroutineSymbol **)SVar17.startLoc);
              local_338 = boost::unordered::detail::foa::
                          table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::SubroutineSymbol_*,_void>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
                          ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::SubroutineSymbol_*,_void>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
                                          *)SVar17.endLoc,(size_t)SVar17.startLoc);
              local_2b0 = local_328;
              local_2c0 = local_330;
              local_2b8 = local_338;
              local_2a8 = local_728;
              boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                        (&local_2d0,local_338);
              do {
                local_2d8 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_2d0);
                local_2e0 = boost::unordered::detail::foa::
                            table_arrays<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
                            ::groups((table_arrays<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
                                      *)0x3515f1);
                local_2e0 = local_2e0 + local_2d8;
                local_2e4 = boost::unordered::detail::foa::
                            group15<boost::unordered::detail::foa::plain_integral>::match
                                      ((group15<boost::unordered::detail::foa::plain_integral> *)
                                       in_stack_fffffffffffff108,(size_t)SVar17.endLoc);
                if (local_2e4 != 0) {
                  local_2f0 = boost::unordered::detail::foa::
                              table_arrays<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
                              ::elements((table_arrays<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
                                          *)0x35164f);
                  local_2f8 = local_2f0 + local_2d8 * 0xf;
                  do {
                    local_2fc = boost::unordered::detail::foa::unchecked_countr_zero(0);
                    this_00 = boost::unordered::detail::foa::
                              table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::SubroutineSymbol_*,_void>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
                              ::pred((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::SubroutineSymbol_*,_void>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
                                      *)0x3516a2);
                    __x_00 = local_2b0;
                    __y_00 = boost::unordered::detail::foa::
                             table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::SubroutineSymbol_const*,slang::syntax::DPIExportSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::SubroutineSymbol_const*,void>,std::equal_to<slang::ast::SubroutineSymbol_const*>,std::allocator<std::pair<slang::ast::SubroutineSymbol_const*const,slang::syntax::DPIExportSyntax_const*>>>
                             ::
                             key_from<std::pair<slang::ast::SubroutineSymbol_const*const,slang::syntax::DPIExportSyntax_const*>>
                                       ((pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>
                                         *)0x3516d5);
                    bVar2 = std::equal_to<const_slang::ast::SubroutineSymbol_*>::operator()
                                      (this_00,__x_00,__y_00);
                    if (bVar2) {
                      boost::unordered::detail::foa::
                      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>
                      ::table_locator(&local_350,local_2e0,local_2fc,local_2f8 + local_2fc);
                      goto LAB_003517f1;
                    }
                    local_2e4 = local_2e4 - 1 & local_2e4;
                  } while (local_2e4 != 0);
                }
                bVar2 = boost::unordered::detail::foa::
                        group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                                  ((group15<boost::unordered::detail::foa::plain_integral> *)
                                   SVar17.endLoc,(size_t)SVar17.startLoc);
                if (bVar2) {
                  memset(&local_350,0,0x18);
                  boost::unordered::detail::foa::
                  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>
                  ::table_locator(&local_350);
                  goto LAB_003517f1;
                }
                bVar2 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                                  (&local_2d0,local_720);
              } while (bVar2);
              memset(&local_350,0,0x18);
              boost::unordered::detail::foa::
              table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>
              ::table_locator(&local_350);
LAB_003517f1:
              bVar2 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                                ((table_locator *)&local_350);
              SVar5 = SVar17.endLoc;
              if (bVar2) {
                local_360 = boost::unordered::detail::foa::
                            table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<const_slang::ast::SubroutineSymbol_*,_void>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
                            ::make_iterator((locator *)0x351813);
                local_361 = false;
                std::
                pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                ::
                pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                          (&local_9a0,&local_360,&local_361);
              }
              else if (local_700 < local_708) {
                SVar20 = local_320;
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::SubroutineSymbol_const*,slang::syntax::DPIExportSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::SubroutineSymbol_const*,void>,std::equal_to<slang::ast::SubroutineSymbol_const*>,std::allocator<std::pair<slang::ast::SubroutineSymbol_const*const,slang::syntax::DPIExportSyntax_const*>>>
                ::
                unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::SubroutineSymbol_const*,slang::syntax::DPIExportSyntax_const*&>
                          ((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::SubroutineSymbol_*,_void>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
                            *)in_stack_fffffffffffff130,(size_t)in_stack_fffffffffffff128,
                           (size_t)in_stack_fffffffffffff120,
                           (try_emplace_args_t *)in_stack_fffffffffffff118,
                           (SubroutineSymbol **)in_stack_fffffffffffff110,
                           (DPIExportSyntax **)
                           CONCAT17(in_stack_fffffffffffff147,
                                    CONCAT16(in_stack_fffffffffffff146,in_stack_fffffffffffff140)));
                local_378 = boost::unordered::detail::foa::
                            table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<const_slang::ast::SubroutineSymbol_*,_void>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
                            ::make_iterator((locator *)0x3518b5);
                local_391[0] = true;
                std::
                pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                ::
                pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                          (&local_9a0,&local_378,local_391);
                SVar17.endLoc = SVar5;
                SVar17.startLoc = SVar20;
              }
              else {
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::SubroutineSymbol_const*,slang::syntax::DPIExportSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::SubroutineSymbol_const*,void>,std::equal_to<slang::ast::SubroutineSymbol_const*>,std::allocator<std::pair<slang::ast::SubroutineSymbol_const*const,slang::syntax::DPIExportSyntax_const*>>>
                ::
                unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::SubroutineSymbol_const*,slang::syntax::DPIExportSyntax_const*&>
                          ((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::SubroutineSymbol_*,_void>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
                            *)in_stack_fffffffffffff190,(size_t)in_stack_fffffffffffff188,
                           (try_emplace_args_t *)in_stack_fffffffffffff180,
                           (SubroutineSymbol **)in_stack_fffffffffffff178,
                           (DPIExportSyntax **)in_stack_fffffffffffff170);
                local_3a8 = boost::unordered::detail::foa::
                            table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<const_slang::ast::SubroutineSymbol_*,_void>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
                            ::make_iterator((locator *)0x351930);
                local_3c1[0] = true;
                std::
                pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                ::
                pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                          (&local_9a0,&local_3a8,local_3c1);
              }
              local_9b0 = std::
                          get<0ul,boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::SubroutineSymbol_const*,slang::syntax::DPIExportSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>*,false>,bool>
                                    ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                                      *)0x351978);
              local_9b8 = std::
                          get<1ul,boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::SubroutineSymbol_const*,slang::syntax::DPIExportSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>*,false>,bool>
                                    ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                                      *)0x35198d);
              if ((*local_9b8 & 1U) == 0) {
                in_stack_fffffffffffff250 = *local_778;
                local_9c4 = 0x4000d;
                SVar18 = parsing::Token::range((Token *)in_stack_fffffffffffff120);
                sourceRange_03.endLoc = in_stack_fffffffffffff248;
                sourceRange_03.startLoc = in_stack_fffffffffffff240;
                local_9d8 = SVar18;
                in_stack_fffffffffffff248 =
                     (SourceLocation)
                     Scope::addDiag((Scope *)in_stack_fffffffffffff238,
                                    in_stack_fffffffffffff250._4_4_,sourceRange_03);
                local_9e8 = (local_850->super_Symbol).name._M_len;
                pcStack_9e0 = (local_850->super_Symbol).name._M_str;
                arg_02._M_str = (char *)in_stack_fffffffffffff150;
                arg_02._M_len = (size_t)in_stack_fffffffffffff148;
                in_stack_fffffffffffff240 =
                     (SourceLocation)
                     Diagnostic::operator<<
                               ((Diagnostic *)
                                CONCAT17(in_stack_fffffffffffff147,
                                         CONCAT16(in_stack_fffffffffffff146,
                                                  in_stack_fffffffffffff140)),arg_02);
                local_9ec = 0xa0001;
                local_9c0 = in_stack_fffffffffffff240;
                ppVar8 = boost::unordered::detail::foa::
                         table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                         ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                       *)SVar17.endLoc);
                in_stack_fffffffffffff238 = parsing::Token::location(&ppVar8->second->name);
                local_9f8 = in_stack_fffffffffffff238;
                Diagnostic::addNote((Diagnostic *)SVar17.endLoc,
                                    SUB84((ulong)in_stack_fffffffffffff110 >> 0x20,0),
                                    in_stack_fffffffffffff108);
              }
              else {
                pDVar1 = *(type *)local_770;
                local_a18._0_2_ = (pDVar1->c_identifier).kind;
                local_a18._2_1_ = (pDVar1->c_identifier).field_0x2;
                local_a18._3_1_ = (pDVar1->c_identifier).numFlags;
                local_a18._4_4_ = (pDVar1->c_identifier).rawLen;
                pIStack_a10 = (pDVar1->c_identifier).info;
                pDVar1 = *(type *)local_770;
                local_a28._0_2_ = (pDVar1->name).kind;
                local_a28._2_1_ = (pDVar1->name).field_0x2;
                local_a28._3_1_ = (pDVar1->name).numFlags;
                local_a28._4_4_ = (pDVar1->name).rawLen;
                pIStack_a20 = (pDVar1->name).info;
                cid_00.info = in_stack_fffffffffffff170;
                cid_00._0_8_ = in_stack_fffffffffffff168;
                TVar14.info._0_4_ = in_stack_fffffffffffff160;
                TVar14._0_8_ = in_stack_fffffffffffff158;
                TVar14.info._4_4_ = in_stack_fffffffffffff164;
                sVar16 = checkDPIMethods::anon_class_1_0_00000001::operator()
                                   ((anon_class_1_0_00000001 *)in_stack_fffffffffffff150,
                                    (Scope *)in_stack_fffffffffffff148,cid_00,TVar14);
                local_a08 = sVar16;
                bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_a08);
                if (!bVar2) {
                  local_a48 = local_850;
                  local_568 = &local_a08;
                  local_570 = (SourceLocation)&local_a48;
                  local_560 = local_5f0;
                  local_290 = local_570;
                  local_288 = local_568;
                  local_280 = local_5f0;
                  paVar9 = boost::unordered::detail::foa::
                           table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>_>
                           ::al((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>_>
                                 *)0x351c30);
                  boost::unordered::detail::foa::
                  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>,_std::basic_string_view<char,_std::char_traits<char>_>_&,_void>
                  ::alloc_cted_or_fwded_key_type(&local_298,paVar9,local_288);
                  local_1c8 = boost::unordered::detail::foa::
                              alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>,_std::basic_string_view<char,_std::char_traits<char>_>_&,_void>
                              ::move_or_fwd(&local_298);
                  local_1c0 = &local_299;
                  local_1d0 = local_290;
                  local_1b8 = local_5f0;
                  local_1d8 = boost::unordered::detail::foa::
                              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SubroutineSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::SubroutineSymbol_const*>>>
                              ::
                              key_from<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SubroutineSymbol_const*>
                                        (local_1c8,local_290);
                  local_1e0 = boost::unordered::detail::foa::
                              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SubroutineSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::SubroutineSymbol_const*>>>
                              ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                                        ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>_>
                                          *)SVar17.endLoc,
                                         (basic_string_view<char,_std::char_traits<char>_> *)
                                         SVar17.startLoc);
                  local_1e8 = boost::unordered::detail::foa::
                              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>_>
                              ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>_>
                                              *)SVar17.endLoc,(size_t)SVar17.startLoc);
                  local_160 = local_1d8;
                  local_170 = local_1e0;
                  local_168 = local_1e8;
                  local_158 = local_5f0;
                  boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                            (&local_180,local_1e8);
                  do {
                    local_188 = boost::unordered::detail::foa::pow2_quadratic_prober::get
                                          (&local_180);
                    local_190 = boost::unordered::detail::foa::
                                table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>_>
                                ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>_>
                                          *)0x351daa);
                    local_190 = local_190 + local_188;
                    local_194 = boost::unordered::detail::foa::
                                group15<boost::unordered::detail::foa::plain_integral>::match
                                          ((group15<boost::unordered::detail::foa::plain_integral> *
                                           )in_stack_fffffffffffff108,(size_t)SVar17.endLoc);
                    if (local_194 != 0) {
                      local_1a0 = boost::unordered::detail::foa::
                                  table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>_>
                                  ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>_>
                                              *)0x351e08);
                      local_1a8 = local_1a0 + local_188 * 0xf;
                      do {
                        local_1ac = boost::unordered::detail::foa::unchecked_countr_zero(0);
                        boost::unordered::detail::foa::
                        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>_>
                        ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>_>
                                *)0x351e5b);
                        boost::unordered::detail::foa::
                        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SubroutineSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::SubroutineSymbol_const*>>>
                        ::
                        key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::SubroutineSymbol_const*>>
                                  ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>
                                    *)0x351e8f);
                        bVar2 = std::
                                equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                                operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                            *)in_stack_fffffffffffff120,
                                           (basic_string_view<char,_std::char_traits<char>_> *)
                                           in_stack_fffffffffffff118,
                                           (basic_string_view<char,_std::char_traits<char>_> *)
                                           in_stack_fffffffffffff110);
                        if (bVar2) {
                          boost::unordered::detail::foa::
                          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>
                          ::table_locator(&local_200,local_190,local_1ac,local_1a8 + local_1ac);
                          goto LAB_00351fab;
                        }
                        local_194 = local_194 - 1 & local_194;
                      } while (local_194 != 0);
                    }
                    bVar2 = boost::unordered::detail::foa::
                            group15<boost::unordered::detail::foa::plain_integral>::
                            is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral>
                                               *)SVar17.endLoc,(size_t)SVar17.startLoc);
                    if (bVar2) {
                      memset(&local_200,0,0x18);
                      boost::unordered::detail::foa::
                      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>
                      ::table_locator(&local_200);
                      goto LAB_00351fab;
                    }
                    bVar2 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                                      (&local_180,(size_t)local_5e8);
                  } while (bVar2);
                  memset(&local_200,0,0x18);
                  boost::unordered::detail::foa::
                  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>
                  ::table_locator(&local_200);
LAB_00351fab:
                  bVar2 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                                    ((table_locator *)&local_200);
                  SVar5 = SVar17.endLoc;
                  if (bVar2) {
                    local_210 = boost::unordered::detail::foa::
                                table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>_>
                                ::make_iterator((locator *)0x351fcb);
                    local_211 = false;
                    std::
                    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                    ::
                    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                              (&local_a40,&local_210,&local_211);
                  }
                  else if (local_5c8 < local_5d0) {
                    SVar20 = local_1d0;
                    boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SubroutineSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::SubroutineSymbol_const*>>>
                    ::
                    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::ast::SubroutineSymbol_const*>
                              ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>_>
                                *)in_stack_fffffffffffff130,(size_t)in_stack_fffffffffffff128,
                               (size_t)in_stack_fffffffffffff120,
                               (try_emplace_args_t *)in_stack_fffffffffffff118,
                               (basic_string_view<char,_std::char_traits<char>_> *)
                               in_stack_fffffffffffff110,
                               (SubroutineSymbol **)
                               CONCAT17(in_stack_fffffffffffff147,
                                        CONCAT16(in_stack_fffffffffffff146,in_stack_fffffffffffff140
                                                )));
                    local_228 = boost::unordered::detail::foa::
                                table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>_>
                                ::make_iterator((locator *)0x35206d);
                    local_241[0] = true;
                    std::
                    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                    ::
                    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                              (&local_a40,&local_228,local_241);
                    SVar17.endLoc = SVar5;
                    SVar17.startLoc = SVar20;
                  }
                  else {
                    boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SubroutineSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::SubroutineSymbol_const*>>>
                    ::
                    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::ast::SubroutineSymbol_const*>
                              ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>_>
                                *)in_stack_fffffffffffff190,(size_t)in_stack_fffffffffffff188,
                               (try_emplace_args_t *)in_stack_fffffffffffff180,
                               in_stack_fffffffffffff178,
                               (SubroutineSymbol **)in_stack_fffffffffffff170);
                    local_258 = boost::unordered::detail::foa::
                                table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>_>
                                ::make_iterator((locator *)0x3520e8);
                    local_271[0] = true;
                    std::
                    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                    ::
                    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                              (&local_a40,&local_258,local_271);
                  }
                  local_a50 = std::
                              get<0ul,boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SubroutineSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>*,false>,bool>
                                        ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                                          *)0x352130);
                  local_a58 = std::
                              get<1ul,boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SubroutineSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>*,false>,bool>
                                        ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                                          *)0x352145);
                  if ((*local_a58 & 1U) == 0) {
                    boost::unordered::detail::foa::
                    table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                    ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                  *)SVar17.endLoc);
                    bVar2 = checkSignaturesMatch
                                      (in_stack_fffffffffffff168,
                                       (SubroutineSymbol *)
                                       CONCAT44(in_stack_fffffffffffff164,in_stack_fffffffffffff160)
                                      );
                    if (!bVar2) {
                      in_stack_fffffffffffff1a8 = *local_778;
                      local_a64 = 0x8000d;
                      SVar18 = parsing::Token::range((Token *)in_stack_fffffffffffff120);
                      in_stack_fffffffffffff1b0 = SVar18.endLoc;
                      sourceRange_04.endLoc = in_stack_fffffffffffff248;
                      sourceRange_04.startLoc = in_stack_fffffffffffff240;
                      local_a78 = SVar18;
                      in_stack_fffffffffffff1a0 =
                           Scope::addDiag((Scope *)in_stack_fffffffffffff238,
                                          in_stack_fffffffffffff250._4_4_,sourceRange_04);
                      arg_03._M_str = (char *)in_stack_fffffffffffff150;
                      arg_03._M_len = (size_t)in_stack_fffffffffffff148;
                      local_a60 = in_stack_fffffffffffff1a0;
                      local_a88 = local_a08;
                      Diagnostic::operator<<
                                ((Diagnostic *)
                                 CONCAT17(in_stack_fffffffffffff147,
                                          CONCAT16(in_stack_fffffffffffff146,
                                                   in_stack_fffffffffffff140)),arg_03);
                      local_a8c = 0xa0001;
                      ppVar10 = boost::unordered::detail::foa::
                                table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                              *)SVar17.endLoc);
                      local_a98 = (ppVar10->second->super_Symbol).location;
                      Diagnostic::addNote((Diagnostic *)SVar17.endLoc,
                                          SUB84((ulong)in_stack_fffffffffffff110 >> 0x20,0),
                                          in_stack_fffffffffffff108);
                    }
                  }
                  std::
                  make_tuple<std::basic_string_view<char,std::char_traits<char>>&,slang::ast::Scope_const*&>
                            ((basic_string_view<char,_std::char_traits<char>_> *)
                             in_stack_fffffffffffff108,(Scope **)SVar17.endLoc);
                  in_stack_fffffffffffff180 = (SubroutineSymbol *)local_6f8;
                  local_550 = &local_ac8;
                  local_558 = local_770;
                  local_148._M_str = (char *)local_770;
                  local_548 = in_stack_fffffffffffff180;
                  local_138 = local_550;
                  local_130 = in_stack_fffffffffffff180;
                  paVar11 = boost::unordered::detail::foa::
                            table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>_>
                            ::al((table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>_>
                                  *)0x352368);
                  in_stack_fffffffffffff178 = &local_148;
                  boost::unordered::detail::foa::
                  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_&&,_void>
                  ::alloc_cted_or_fwded_key_type
                            ((alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_&&,_void>
                              *)in_stack_fffffffffffff178,paVar11,local_138);
                  local_78 = boost::unordered::detail::foa::
                             alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_&&,_void>
                             ::move_or_fwd((alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_&&,_void>
                                            *)in_stack_fffffffffffff178);
                  local_70 = &local_149;
                  local_80 = (SourceLocation)local_148._M_str;
                  in_stack_fffffffffffff168 = in_stack_fffffffffffff180;
                  local_68 = in_stack_fffffffffffff180;
                  local_88 = (Diagnostic *)
                             boost::unordered::detail::foa::
                             table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,slang::syntax::DPIExportSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,slang::syntax::DPIExportSyntax_const*>>>
                             ::
                             key_from<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,slang::syntax::DPIExportSyntax_const*>
                                       (local_78,local_148._M_str);
                  in_stack_fffffffffffff190 =
                       (table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>_>
                        *)boost::unordered::detail::foa::
                          table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,slang::syntax::DPIExportSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,slang::syntax::DPIExportSyntax_const*>>>
                          ::
                          hash_for<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>
                                    ((table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>_>
                                      *)SVar17.endLoc,
                                     (tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                                      *)SVar17.startLoc);
                  local_90 = in_stack_fffffffffffff190;
                  in_stack_fffffffffffff170 =
                       (Info *)boost::unordered::detail::foa::
                               table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>_>
                               ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>_>
                                               *)SVar17.endLoc,(size_t)SVar17.startLoc);
                  local_10 = local_88;
                  local_20 = local_90;
                  in_stack_fffffffffffff188 = in_stack_fffffffffffff168;
                  local_98 = in_stack_fffffffffffff170;
                  local_18 = in_stack_fffffffffffff170;
                  local_8 = in_stack_fffffffffffff168;
                  boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                            (&local_30,(size_t)in_stack_fffffffffffff170);
                  do {
                    local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
                    local_40 = boost::unordered::detail::foa::
                               table_arrays<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>_>
                               ::groups((table_arrays<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>_>
                                         *)0x3524d6);
                    local_40 = local_40 + local_38;
                    in_stack_fffffffffffff164 =
                         boost::unordered::detail::foa::
                         group15<boost::unordered::detail::foa::plain_integral>::match
                                   ((group15<boost::unordered::detail::foa::plain_integral> *)
                                    in_stack_fffffffffffff108,(size_t)SVar17.endLoc);
                    local_44 = in_stack_fffffffffffff164;
                    if (in_stack_fffffffffffff164 != 0) {
                      local_50 = boost::unordered::detail::foa::
                                 table_arrays<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>_>
                                 ::elements((table_arrays<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>_>
                                             *)0x35252b);
                      local_58 = local_50 + local_38 * 0xf;
                      do {
                        local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
                        in_stack_fffffffffffff148 =
                             (Type *)boost::unordered::detail::foa::
                                     table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>_>
                                     ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>_>
                                             *)0x35257b);
                        in_stack_fffffffffffff150 = local_10;
                        in_stack_fffffffffffff158 =
                             boost::unordered::detail::foa::
                             table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,slang::syntax::DPIExportSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,slang::syntax::DPIExportSyntax_const*>>>
                             ::
                             key_from<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,slang::syntax::DPIExportSyntax_const*>>
                                       ((pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>
                                         *)0x3525a8);
                        in_stack_fffffffffffff147 =
                             std::
                             equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>
                             ::operator()((equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>
                                           *)SVar17.endLoc,
                                          (tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                                           *)SVar17.startLoc,
                                          (tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                                           *)0x3525c3);
                        if ((bool)in_stack_fffffffffffff147) {
                          boost::unordered::detail::foa::
                          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>
                          ::table_locator(&local_b0,local_40,local_5c,local_58 + local_5c);
                          goto LAB_003526b9;
                        }
                        local_44 = local_44 - 1 & local_44;
                      } while (local_44 != 0);
                    }
                    in_stack_fffffffffffff146 =
                         boost::unordered::detail::foa::
                         group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                                   ((group15<boost::unordered::detail::foa::plain_integral> *)
                                    SVar17.endLoc,(size_t)SVar17.startLoc);
                    if ((bool)in_stack_fffffffffffff146) {
                      memset(&local_b0,0,0x18);
                      boost::unordered::detail::foa::
                      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>
                      ::table_locator(&local_b0);
                      goto LAB_003526b9;
                    }
                    bVar2 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                                      (&local_30,
                                       (in_stack_fffffffffffff168->super_Symbol).name._M_len);
                  } while (bVar2);
                  memset(&local_b0,0,0x18);
                  boost::unordered::detail::foa::
                  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>
                  ::table_locator(&local_b0);
LAB_003526b9:
                  bVar2 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                                    ((table_locator *)&local_b0);
                  SVar5 = SVar17.endLoc;
                  if (bVar2) {
                    local_c0 = boost::unordered::detail::foa::
                               table<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>_>
                               ::make_iterator((locator *)0x3526db);
                    local_c1 = false;
                    std::
                    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                    ::
                    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                              (&local_ab0,&local_c0,&local_c1);
                  }
                  else if ((in_stack_fffffffffffff188->super_Symbol).nextInScope <
                           (Symbol *)(in_stack_fffffffffffff188->super_Symbol).parentScope) {
                    SVar20 = local_80;
                    boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,slang::syntax::DPIExportSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,slang::syntax::DPIExportSyntax_const*>>>
                    ::
                    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,slang::syntax::DPIExportSyntax_const*&>
                              ((table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>_>
                                *)in_stack_fffffffffffff130,(size_t)in_stack_fffffffffffff128,
                               (size_t)in_stack_fffffffffffff120,
                               (try_emplace_args_t *)in_stack_fffffffffffff118,
                               (tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                                *)in_stack_fffffffffffff110,
                               (DPIExportSyntax **)
                               CONCAT17(in_stack_fffffffffffff147,
                                        CONCAT16(in_stack_fffffffffffff146,in_stack_fffffffffffff140
                                                )));
                    local_d8 = boost::unordered::detail::foa::
                               table<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>_>
                               ::make_iterator((locator *)0x35277d);
                    local_f1[0] = true;
                    std::
                    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                    ::
                    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                              (&local_ab0,&local_d8,local_f1);
                    SVar17.endLoc = SVar5;
                    SVar17.startLoc = SVar20;
                  }
                  else {
                    boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,slang::syntax::DPIExportSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,slang::syntax::DPIExportSyntax_const*>>>
                    ::
                    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,slang::syntax::DPIExportSyntax_const*&>
                              (in_stack_fffffffffffff190,(size_t)in_stack_fffffffffffff188,
                               (try_emplace_args_t *)in_stack_fffffffffffff180,
                               (tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                                *)in_stack_fffffffffffff178,
                               (DPIExportSyntax **)in_stack_fffffffffffff170);
                    local_108 = boost::unordered::detail::foa::
                                table<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>_>
                                ::make_iterator((locator *)0x3527f8);
                    local_121[0] = true;
                    std::
                    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                    ::
                    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                              (&local_ab0,&local_108,local_121);
                  }
                  std::
                  get<0ul,boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,slang::syntax::DPIExportSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>*,false>,bool>
                            ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                              *)0x352840);
                  ptVar12 = std::
                            get<1ul,boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,slang::syntax::DPIExportSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>*,false>,bool>
                                      ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                                        *)0x352855);
                  if ((*ptVar12 & 1U) == 0) {
                    in_stack_fffffffffffff128 = *local_778;
                    SVar18 = parsing::Token::range((Token *)in_stack_fffffffffffff120);
                    in_stack_fffffffffffff130 = SVar18.endLoc;
                    sourceRange_05.endLoc = in_stack_fffffffffffff248;
                    sourceRange_05.startLoc = in_stack_fffffffffffff240;
                    in_stack_fffffffffffff110 =
                         Scope::addDiag((Scope *)in_stack_fffffffffffff238,
                                        in_stack_fffffffffffff250._4_4_,sourceRange_05);
                    arg_04._M_str = (char *)in_stack_fffffffffffff150;
                    arg_04._M_len = (size_t)in_stack_fffffffffffff148;
                    in_stack_fffffffffffff120 = in_stack_fffffffffffff110;
                    Diagnostic::operator<<
                              ((Diagnostic *)
                               CONCAT17(in_stack_fffffffffffff147,
                                        CONCAT16(in_stack_fffffffffffff146,in_stack_fffffffffffff140
                                                )),arg_04);
                    ppVar13 = boost::unordered::detail::foa::
                              table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                              ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                            *)SVar17.endLoc);
                    in_stack_fffffffffffff118 = parsing::Token::location(&ppVar13->second->name);
                    Diagnostic::addNote((Diagnostic *)SVar17.endLoc,
                                        SUB84((ulong)in_stack_fffffffffffff110 >> 0x20,0),
                                        in_stack_fffffffffffff108);
                  }
                }
              }
            }
          }
          else {
            local_88c = 0x3000d;
            SVar18 = parsing::Token::range((Token *)in_stack_fffffffffffff120);
            sourceRange_01.endLoc = in_stack_fffffffffffff248;
            sourceRange_01.startLoc = in_stack_fffffffffffff240;
            local_8a0 = SVar18;
            local_888 = Scope::addDiag((Scope *)in_stack_fffffffffffff238,
                                       in_stack_fffffffffffff250._4_4_,sourceRange_01);
            local_8a4 = 0x50001;
            local_8b0 = (local_850->super_Symbol).location;
            Diagnostic::addNote((Diagnostic *)SVar17.endLoc,
                                SUB84((ulong)in_stack_fffffffffffff110 >> 0x20,0),
                                in_stack_fffffffffffff108);
          }
        }
      }
      else {
        local_80c = 0x23000a;
        SVar18 = parsing::Token::range((Token *)in_stack_fffffffffffff120);
        sourceRange.endLoc = in_stack_fffffffffffff248;
        sourceRange.startLoc = in_stack_fffffffffffff240;
        local_820 = SVar18;
        Scope::addDiag((Scope *)in_stack_fffffffffffff238,in_stack_fffffffffffff250._4_4_,
                       sourceRange);
        arg_01._M_str = (char *)in_stack_fffffffffffff150;
        arg_01._M_len = (size_t)in_stack_fffffffffffff148;
        local_838 = local_7c0;
        local_808 = Diagnostic::operator<<
                              ((Diagnostic *)
                               CONCAT17(in_stack_fffffffffffff147,
                                        CONCAT16(in_stack_fffffffffffff146,in_stack_fffffffffffff140
                                                )),arg_01);
        local_83c = 0x50001;
        local_848 = local_7c8->location;
        Diagnostic::addNote((Diagnostic *)SVar17.endLoc,
                            SUB84((ulong)in_stack_fffffffffffff110 >> 0x20,0),
                            in_stack_fffffffffffff108);
      }
    }
LAB_00352994:
    __gnu_cxx::
    __normal_iterator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_*,_std::vector<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_>_>_>
    ::operator++(&local_750);
  } while( true );
}

Assistant:

void Compilation::checkDPIMethods(std::span<const SubroutineSymbol* const> dpiImports) {
    auto getCId = [&](const Scope& scope, Token cid, Token name) {
        std::string_view text = cid ? cid.valueText() : name.valueText();
        if (!text.empty()) {
            auto tail = text.substr(1);
            if (!isValidCIdChar(text[0]) || isDecimalDigit(text[0]) ||
                std::ranges::any_of(tail, [](char c) { return !isValidCIdChar(c); })) {
                scope.addDiag(diag::InvalidDPICIdentifier, cid ? cid.range() : name.range())
                    << text;
                return std::string_view();
            }
        }
        return text;
    };

    flat_hash_map<std::string_view, const SubroutineSymbol*> nameMap;
    for (auto sub : dpiImports) {
        auto syntax = sub->getSyntax();
        SLANG_ASSERT(syntax);

        auto scope = sub->getParentScope();
        SLANG_ASSERT(scope);

        auto& dis = syntax->as<DPIImportSyntax>();
        std::string_view cId = getCId(*scope, dis.c_identifier, dis.method->name->getLastToken());
        if (cId.empty())
            continue;

        auto [it, inserted] = nameMap.emplace(cId, sub);
        if (!inserted) {
            if (!checkSignaturesMatch(*sub, *it->second)) {
                auto& diag = scope->addDiag(diag::DPISignatureMismatch, sub->location);
                diag << cId;
                diag.addNote(diag::NotePreviousDefinition, it->second->location);
            }
        }
    }

    flat_hash_map<std::tuple<std::string_view, const Scope*>, const DPIExportSyntax*>
        exportsByScope;
    flat_hash_map<const SubroutineSymbol*, const DPIExportSyntax*> previousExports;
    auto exports = dpiExports;
    for (auto [syntax, scope] : exports) {
        if (syntax->specString.valueText() == "DPI")
            scope->addDiag(diag::DPISpecDisallowed, syntax->specString.range());

        auto name = syntax->name.valueText();
        auto symbol = Lookup::unqualifiedAt(*scope, name, LookupLocation::max,
                                            syntax->name.range());
        if (!symbol)
            continue;

        if (symbol->kind != SymbolKind::Subroutine) {
            auto& diag = scope->addDiag(diag::NotASubroutine, syntax->name.range()) << name;
            diag.addNote(diag::NoteDeclarationHere, symbol->location);
            continue;
        }

        // This check is a little verbose because we're avoiding issuing an error if the
        // functionOrTask keyword is invalid, i.e. not 'function' or 'task'.
        auto& sub = symbol->as<SubroutineSymbol>();
        if ((sub.subroutineKind == SubroutineKind::Function &&
             syntax->functionOrTask.kind == TokenKind::TaskKeyword) ||
            (sub.subroutineKind == SubroutineKind::Task &&
             syntax->functionOrTask.kind == TokenKind::FunctionKeyword)) {
            auto& diag = scope->addDiag(diag::DPIExportKindMismatch,
                                        syntax->functionOrTask.range());
            diag.addNote(diag::NoteDeclarationHere, symbol->location);
            continue;
        }

        if (sub.getParentScope() != scope) {
            auto& diag = scope->addDiag(diag::DPIExportDifferentScope, syntax->name.range());
            diag.addNote(diag::NoteDeclarationHere, sub.location);
            continue;
        }

        if (sub.flags.has(MethodFlags::DPIImport)) {
            auto& diag = scope->addDiag(diag::DPIExportImportedFunc, syntax->name.range());
            diag.addNote(diag::NoteDeclarationHere, sub.location);
            continue;
        }

        auto& retType = sub.getReturnType();
        if (!retType.isValidForDPIReturn() && !retType.isError()) {
            auto& diag = scope->addDiag(diag::InvalidDPIReturnType, sub.location);
            diag << retType;
            diag.addNote(diag::NoteDeclarationHere, syntax->name.location());
            continue;
        }

        for (auto arg : sub.getArguments()) {
            if (arg->direction == ArgumentDirection::Ref)
                scope->addDiag(diag::DPIRefArg, arg->location);

            auto& type = arg->getType();
            if (!type.isValidForDPIArg() && !type.isError()) {
                auto& diag = scope->addDiag(diag::InvalidDPIArgType, arg->location);
                diag << type;
                diag.addNote(diag::NoteDeclarationHere, syntax->name.location());
                continue;
            }
        }

        {
            auto [it, inserted] = previousExports.emplace(&sub, syntax);
            if (!inserted) {
                auto& diag = scope->addDiag(diag::DPIExportDuplicate, syntax->name.range())
                             << sub.name;
                diag.addNote(diag::NotePreviousDefinition, it->second->name.location());
                continue;
            }
        }

        std::string_view cId = getCId(*scope, syntax->c_identifier, syntax->name);
        if (!cId.empty()) {
            {
                auto [it, inserted] = nameMap.emplace(cId, &sub);
                if (!inserted) {
                    if (!checkSignaturesMatch(sub, *it->second)) {
                        auto& diag = scope->addDiag(diag::DPISignatureMismatch,
                                                    syntax->name.range());
                        diag << cId;
                        diag.addNote(diag::NotePreviousDefinition, it->second->location);
                    }
                }
            }
            {
                auto [it, inserted] = exportsByScope.emplace(std::make_tuple(cId, scope), syntax);
                if (!inserted) {
                    auto& diag = scope->addDiag(diag::DPIExportDuplicateCId, syntax->name.range());
                    diag << cId;
                    diag.addNote(diag::NotePreviousDefinition, it->second->name.location());
                }
            }
        }
    }
}